

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block_manager.cpp
# Opt level: O2

void __thiscall duckdb::BlockManager::UnregisterBlock(BlockManager *this,block_id_t id)

{
  block_id_t local_20;
  
  local_20 = id;
  ::std::mutex::lock(&this->blocks_lock);
  ::std::
  _Hashtable<long,_std::pair<const_long,_duckdb::weak_ptr<duckdb::BlockHandle,_true>_>,_std::allocator<std::pair<const_long,_duckdb::weak_ptr<duckdb::BlockHandle,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::_M_erase(&(this->blocks)._M_h,&local_20);
  pthread_mutex_unlock((pthread_mutex_t *)&this->blocks_lock);
  return;
}

Assistant:

void BlockManager::UnregisterBlock(block_id_t id) {
	D_ASSERT(id < MAXIMUM_BLOCK);
	lock_guard<mutex> lock(blocks_lock);
	// on-disk block: erase from list of blocks in manager
	blocks.erase(id);
}